

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptRegExpConstructor::DeleteProperty
          (JavascriptRegExpConstructor *this,JavascriptString *propertyNameString,
          PropertyOperationFlags flags)

{
  int iVar1;
  ScriptContext *scriptContext;
  BOOL BVar2;
  char16 *varName;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  local_30 = (PropertyRecord *)0x0;
  ScriptContext::GetOrAddPropertyRecord
            ((((((propertyNameString->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_30);
  iVar1 = local_30->pid;
  if (((((((iVar1 == BuiltInPropertyRecords::input._8_4_) ||
          (iVar1 == BuiltInPropertyRecords::__._8_4_)) ||
         (iVar1 == BuiltInPropertyRecords::lastMatch._8_4_)) ||
        ((iVar1 == BuiltInPropertyRecords::_Ampersand._8_4_ ||
         (iVar1 == BuiltInPropertyRecords::lastParen._8_4_)))) ||
       (((iVar1 == BuiltInPropertyRecords::_Plus._8_4_ ||
         ((iVar1 == BuiltInPropertyRecords::leftContext._8_4_ ||
          (iVar1 == BuiltInPropertyRecords::_BackTick._8_4_)))) ||
        (iVar1 == BuiltInPropertyRecords::rightContext._8_4_)))) ||
      ((((iVar1 == BuiltInPropertyRecords::_Tick._8_4_ ||
         (iVar1 == BuiltInPropertyRecords::_1._8_4_)) || (iVar1 == BuiltInPropertyRecords::_2._8_4_)
        ) || (((iVar1 == BuiltInPropertyRecords::_3._8_4_ ||
               (iVar1 == BuiltInPropertyRecords::_4._8_4_)) ||
              ((iVar1 == BuiltInPropertyRecords::_5._8_4_ ||
               ((iVar1 == BuiltInPropertyRecords::_6._8_4_ ||
                (iVar1 == BuiltInPropertyRecords::_7._8_4_)))))))))) ||
     ((iVar1 == BuiltInPropertyRecords::_8._8_4_ ||
      ((iVar1 == BuiltInPropertyRecords::_9._8_4_ || (iVar1 == BuiltInPropertyRecords::index._8_4_))
      )))) {
    scriptContext =
         (((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    varName = JavascriptString::GetString(propertyNameString);
    JavascriptError::ThrowCantDeleteIfStrictMode(flags,scriptContext,varName);
    BVar2 = 0;
  }
  else {
    BVar2 = JavascriptFunction::DeleteProperty((JavascriptFunction *)this,propertyNameString,flags);
  }
  return BVar2;
}

Assistant:

BOOL JavascriptRegExpConstructor::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags flags)
    {
        PropertyRecord const * propertyRecord = nullptr;
        propertyNameString->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        PropertyId propertyId = propertyRecord->GetPropertyId();

        if (BuiltInPropertyRecords::input.Equals(propertyId)
            || BuiltInPropertyRecords::$_.Equals(propertyId)
            || BuiltInPropertyRecords::lastMatch.Equals(propertyId)
            || BuiltInPropertyRecords::$Ampersand.Equals(propertyId)
            || BuiltInPropertyRecords::lastParen.Equals(propertyId)
            || BuiltInPropertyRecords::$Plus.Equals(propertyId)
            || BuiltInPropertyRecords::leftContext.Equals(propertyId)
            || BuiltInPropertyRecords::$BackTick.Equals(propertyId)
            || BuiltInPropertyRecords::rightContext.Equals(propertyId)
            || BuiltInPropertyRecords::$Tick.Equals(propertyId)
            || BuiltInPropertyRecords::$1.Equals(propertyId)
            || BuiltInPropertyRecords::$2.Equals(propertyId)
            || BuiltInPropertyRecords::$3.Equals(propertyId)
            || BuiltInPropertyRecords::$4.Equals(propertyId)
            || BuiltInPropertyRecords::$5.Equals(propertyId)
            || BuiltInPropertyRecords::$6.Equals(propertyId)
            || BuiltInPropertyRecords::$7.Equals(propertyId)
            || BuiltInPropertyRecords::$8.Equals(propertyId)
            || BuiltInPropertyRecords::$9.Equals(propertyId)
            || BuiltInPropertyRecords::index.Equals(propertyId))
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(flags, GetScriptContext(), propertyNameString->GetString());
            return false;
        }

        return JavascriptFunction::DeleteProperty(propertyNameString, flags);
    }